

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O3

int csp_conn_print_table_str(char *str_buf,int str_size)

{
  size_t sVar1;
  ulong uVar2;
  csp_conn_t *pcVar3;
  bool bVar4;
  char buf [100];
  
  pcVar3 = arr_conn;
  uVar2 = 0;
  do {
    snprintf(buf,100,"[%02u %p] S:%u, %u -> %u, %u -> %u (%u)\n",uVar2 & 0xffffffff,pcVar3,
             (ulong)(uint)pcVar3->state,(ulong)(pcVar3->idin).src,(ulong)(pcVar3->idin).dst,
             (ulong)(pcVar3->idin).dport,(ulong)(pcVar3->idin).sport,(ulong)pcVar3->sport_outgoing);
    strncat(str_buf,buf,(long)str_size);
    sVar1 = strlen(buf);
    str_size = str_size - (int)sVar1;
    if (str_size < 1) {
      return 0;
    }
    pcVar3 = pcVar3 + 1;
    bVar4 = uVar2 != 7;
    uVar2 = uVar2 + 1;
  } while (bVar4);
  return 0;
}

Assistant:

int csp_conn_print_table_str(char * str_buf, int str_size) {

	/* Display up to 10 connections */
	unsigned int start = (CSP_CONN_MAX > 10) ? (CSP_CONN_MAX - 10) : 0;

	for (unsigned int i = start; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];
		char buf[100];
		snprintf(buf, sizeof(buf), "[%02u %p] S:%u, %u -> %u, %u -> %u (%u)\n",
				 i, (void *)conn, conn->state, conn->idin.src, conn->idin.dst,
				 conn->idin.dport, conn->idin.sport, conn->sport_outgoing);

		strncat(str_buf, buf, str_size);
		if ((str_size -= strlen(buf)) <= 0) {
			break;
		}
	}

	return CSP_ERR_NONE;
}